

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util.cc
# Opt level: O0

void ctemplate::CreateOrCleanTestDirAndSetAsTmpdir(string *dirname)

{
  long lVar1;
  char *__dest;
  char *__src;
  string *dirname_local;
  
  CreateOrCleanTestDir(dirname);
  if (g_tmpdir != (char *)0x0) {
    operator_delete__(g_tmpdir);
  }
  lVar1 = std::__cxx11::string::length();
  __dest = (char *)operator_new__(lVar1 + 1);
  g_tmpdir = __dest;
  __src = (char *)std::__cxx11::string::c_str();
  strcpy(__dest,__src);
  return;
}

Assistant:

void CreateOrCleanTestDirAndSetAsTmpdir(const string& dirname) {
  CreateOrCleanTestDir(dirname);
  delete[] g_tmpdir;
  g_tmpdir = new char[dirname.length() + 1];
  strcpy(g_tmpdir, dirname.c_str());
}